

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmStrCat<char,std::__cxx11::string,char>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char *args,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char *args_2)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  char local_a8 [32];
  undefined8 local_88;
  char *local_80;
  char local_78 [32];
  basic_string_view<char,_std::char_traits<char>_> local_58;
  size_t local_48;
  char *pcStack_40;
  undefined8 local_38;
  char *local_30;
  size_type local_28;
  pointer local_20;
  undefined8 local_18;
  char *local_10;
  
  local_58._M_len = (a->View_)._M_len;
  local_58._M_str = (a->View_)._M_str;
  local_48 = (b->View_)._M_len;
  pcStack_40 = (b->View_)._M_str;
  local_78[0] = *args;
  local_80 = local_78;
  local_88 = 1;
  local_38 = 1;
  local_20 = (args_1->_M_dataplus)._M_p;
  local_28 = args_1->_M_string_length;
  local_a8[0] = *args_2;
  local_10 = local_a8;
  local_18 = 1;
  views._M_len = 5;
  views._M_array = &local_58;
  local_30 = local_80;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}